

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Int FT_Face_GetCharVariantIsDefault(FT_Face face,FT_ULong charcode,FT_ULong variantSelector)

{
  code *UNRECOVERED_JUMPTABLE;
  FT_Int FVar1;
  FT_CMap_conflict vcmap;
  FT_CharMap pFVar2;
  
  if (face != (FT_Face)0x0) {
    pFVar2 = find_variant_selector_charmap(face);
    if (pFVar2 != (FT_CharMap)0x0) {
      UNRECOVERED_JUMPTABLE = (code *)(pFVar2[1].face)->style_name;
      FVar1 = (*UNRECOVERED_JUMPTABLE)
                        (pFVar2,charcode & 0xffffffff,variantSelector & 0xffffffff,
                         UNRECOVERED_JUMPTABLE);
      return FVar1;
    }
  }
  return -1;
}

Assistant:

FT_EXPORT_DEF( FT_Int )
  FT_Face_GetCharVariantIsDefault( FT_Face   face,
                                   FT_ULong  charcode,
                                   FT_ULong  variantSelector )
  {
    FT_Int  result = -1;


    if ( face )
    {
      FT_CharMap  charmap = find_variant_selector_charmap( face );


      if ( charmap )
      {
        FT_CMap  vcmap = FT_CMAP( charmap );


        if ( charcode > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "FT_Face_GetCharVariantIsDefault:"
                      " too large charcode" ));
          FT_TRACE1(( " 0x%lx is truncated\n", charcode ));
        }
        if ( variantSelector > 0xFFFFFFFFUL )
        {
          FT_TRACE1(( "FT_Face_GetCharVariantIsDefault:"
                      " too large variantSelector" ));
          FT_TRACE1(( " 0x%lx is truncated\n", variantSelector ));
        }

        result = vcmap->clazz->char_var_default( vcmap,
                                                 (FT_UInt32)charcode,
                                                 (FT_UInt32)variantSelector );
      }
    }

    return result;
  }